

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.h
# Opt level: O2

bool __thiscall
wasm::analysis::Vector<wasm::analysis::Bool>::join
          (Vector<wasm::analysis::Bool> *this,Element *joinee,SingletonElement *joiner)

{
  ulong i;
  bool bVar1;
  unsigned_long *index;
  
  i = (joiner->super_pair<unsigned_long,_bool>).first;
  if (i < (ulong)(joinee->super__Bvector_base<std::allocator<bool>_>)._M_impl.
                 super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset +
          ((long)(joinee->super__Bvector_base<std::allocator<bool>_>)._M_impl.
                 super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p -
          (long)(joinee->super__Bvector_base<std::allocator<bool>_>)._M_impl.
                super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p) * 8) {
    bVar1 = joinAtIndex(this,joinee,i,&(joiner->super_pair<unsigned_long,_bool>).second);
    return bVar1;
  }
  __assert_fail("index < joinee.size()",
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/analysis/lattices/vector.h"
                ,0x5f,
                "bool wasm::analysis::Vector<wasm::analysis::Bool>::join(Element &, const SingletonElement &) const [L = wasm::analysis::Bool]"
               );
}

Assistant:

bool join(Element& joinee, const SingletonElement& joiner) const noexcept {
    const auto& [index, elem] = joiner;
    assert(index < joinee.size());
    return joinAtIndex(joinee, index, elem);
  }